

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

void __thiscall
testing::TestEventListeners::SetDefaultResultPrinter
          (TestEventListeners *this,TestEventListener *listener)

{
  TestEventListener *pTVar1;
  
  pTVar1 = this->default_result_printer_;
  if (pTVar1 != listener) {
    this->default_result_printer_ = (TestEventListener *)0x0;
    pTVar1 = internal::TestEventRepeater::Release(this->repeater_,pTVar1);
    if (pTVar1 != (TestEventListener *)0x0) {
      (*pTVar1->_vptr_TestEventListener[1])(pTVar1);
    }
    this->default_result_printer_ = listener;
    if (listener != (TestEventListener *)0x0) {
      internal::TestEventRepeater::Append(this->repeater_,listener);
      return;
    }
  }
  return;
}

Assistant:

void TestEventListeners::SetDefaultResultPrinter(TestEventListener* listener) {
  if (default_result_printer_ != listener) {
    // It is an error to pass this method a listener that is already in the
    // list.
    delete Release(default_result_printer_);
    default_result_printer_ = listener;
    if (listener != NULL)
      Append(listener);
  }
}